

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O0

void __thiscall libchars::validation::validation(validation *this)

{
  validation *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->n2i);
  std::
  map<int,_const_libchars::validator_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_libchars::validator_*>_>_>
  ::map(&this->i2v);
  this->generator = 0x80;
  return;
}

Assistant:

validation() : generator(validator::AUTO) {}